

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

bool __thiscall
miniply::PLYReader::ascii_value(PLYReader *this,PLYPropertyType propType,uint8_t *value)

{
  bool bVar1;
  uint in_EAX;
  int *value_00;
  int tmpInt;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (propType < Int) {
    value_00 = (int *)((long)&uStack_28 + 4);
  }
  else {
    value_00 = (int *)value;
    if (1 < propType - Int) {
      if (propType == Float) {
        bVar1 = float_literal(this,(float *)value);
      }
      else {
        bVar1 = miniply::double_literal(this->m_pos,&this->m_end,(double *)value);
      }
      goto LAB_0010642b;
    }
  }
  bVar1 = int_literal(this,value_00);
LAB_0010642b:
  this->m_valid = bVar1;
  if (bVar1 != false) {
    advance(this);
    switch(propType) {
    case Char:
    case UChar:
      *value = uStack_28._4_1_;
      break;
    case Short:
    case UShort:
      *(undefined2 *)value = uStack_28._4_2_;
    }
  }
  return bVar1;
}

Assistant:

bool PLYReader::ascii_value(PLYPropertyType propType, uint8_t value[8])
  {
    int tmpInt = 0;

    switch (propType) {
    case PLYPropertyType::Char:
    case PLYPropertyType::UChar:
    case PLYPropertyType::Short:
    case PLYPropertyType::UShort:
      m_valid = int_literal(&tmpInt);
      break;
    case PLYPropertyType::Int:
    case PLYPropertyType::UInt:
      m_valid = int_literal(reinterpret_cast<int*>(value));
      break;
    case PLYPropertyType::Float:
      m_valid = float_literal(reinterpret_cast<float*>(value));
      break;
    case PLYPropertyType::Double:
    default:
      m_valid = double_literal(reinterpret_cast<double*>(value));
      break;
    }

    if (!m_valid) {
      return false;
    }
    advance();

    switch (propType) {
    case PLYPropertyType::Char:
      reinterpret_cast<int8_t*>(value)[0] = static_cast<int8_t>(tmpInt);
      break;
    case PLYPropertyType::UChar:
      value[0] = static_cast<uint8_t>(tmpInt);
      break;
    case PLYPropertyType::Short:
      reinterpret_cast<int16_t*>(value)[0] = static_cast<int16_t>(tmpInt);
      break;
    case PLYPropertyType::UShort:
      reinterpret_cast<uint16_t*>(value)[0] = static_cast<uint16_t>(tmpInt);
      break;
    default:
      break;
    }
    return true;
  }